

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildRecursive
          (BVHAggregate *this,
          vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
          *threadAllocators,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,int start,
          int end,atomic<int> *totalNodes,atomic<int> *orderedPrimsOffset,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  BVHPrimitive *pBVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar8;
  undefined4 uVar12;
  undefined4 uVar13;
  memory_resource *pmVar14;
  pointer pPVar15;
  pointer pPVar16;
  bool bVar17;
  float fVar18;
  long lVar19;
  size_t sVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  size_t sVar27;
  undefined8 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  undefined4 uVar102;
  undefined4 uVar103;
  undefined4 uVar104;
  undefined4 uVar105;
  undefined4 uVar106;
  undefined4 uVar107;
  undefined4 uVar108;
  undefined4 uVar109;
  undefined4 uVar110;
  undefined4 uVar111;
  undefined4 uVar112;
  undefined4 uVar113;
  undefined4 uVar114;
  undefined4 uVar115;
  undefined4 uVar116;
  undefined8 uVar117;
  BVHPrimitive __value;
  BVHPrimitive __value_00;
  BVHPrimitive __value_01;
  BVHPrimitive __value_02;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [12];
  undefined8 uVar122;
  undefined4 uVar123;
  undefined8 uVar124;
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined8 uVar127;
  undefined1 auVar128 [12];
  undefined1 auVar129 [12];
  undefined8 uVar130;
  undefined1 auVar131 [12];
  undefined1 auVar132 [12];
  undefined8 uVar133;
  undefined1 auVar134 [12];
  undefined1 auVar135 [12];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims_00;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives_00;
  BVHAggregate *this_00;
  vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  *threadAllocators_00;
  int iVar141;
  undefined4 extraout_var;
  long lVar142;
  ulong uVar143;
  Point3f *pPVar144;
  pointer pBVar145;
  float *pfVar146;
  long lVar147;
  ulong uVar148;
  pointer pBVar149;
  uint uVar150;
  float *pfVar151;
  pointer pBVar152;
  undefined1 this_01 [8];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:271:38)>
  __comp;
  long lVar153;
  Point3f *pPVar154;
  int *piVar155;
  pointer pBVar156;
  long lVar157;
  undefined4 *puVar158;
  uint *puVar159;
  pointer pBVar160;
  int iVar161;
  Point3f *pPVar162;
  pointer pBVar163;
  Point3f *pPVar164;
  pointer pBVar165;
  pointer pBVar166;
  BVHPrimitive *__i;
  int *in_FS_OFFSET;
  bool bVar167;
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  float fVar181;
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar186;
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  int mid;
  BVHPrimitive __tmp;
  BVHBuildNode *children [2];
  int countAbove [11];
  int countBelow [11];
  Bounds3f boundsAbove [11];
  int local_49c;
  int local_498;
  int local_494;
  pointer local_490;
  pointer local_488;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_480;
  pointer local_478;
  __atomic_base<int> *local_470;
  pointer local_468;
  undefined1 local_460 [8];
  undefined8 local_458;
  vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  *local_450;
  undefined1 local_448 [16];
  undefined4 uStack_438;
  undefined4 uStack_434;
  uint auStack_430 [4];
  undefined4 uStack_420;
  undefined4 uStack_41c;
  int local_314;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  long *local_2f8;
  undefined8 uStack_2f0;
  code *pcStack_2e8;
  code *pcStack_2e0;
  size_t sStack_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  float afStack_2bc [5];
  BVHBuildNode *local_2a8 [5];
  undefined4 local_27c [57];
  int aiStack_198 [19];
  float fStack_14c;
  uint auStack_148 [2];
  float fStack_140;
  uint uStack_13c;
  undefined8 auStack_138 [30];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  local_498 = end;
  local_494 = start;
  local_470 = &totalNodes->super___atomic_base<int>;
  pbrt::ThreadIndex::__tls_init();
  pmVar14 = (threadAllocators->
            super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
            )._M_impl.super__Vector_impl_data._M_start[*in_FS_OFFSET].memoryResource;
  iVar141 = (*pmVar14->_vptr_memory_resource[2])(pmVar14,0x38,8);
  local_460 = (undefined1  [8])CONCAT44(extraout_var,iVar141);
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0
  ;
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  ((BVHBuildNode *)local_460)->children[0] = (BVHBuildNode *)0x0;
  ((BVHBuildNode *)local_460)->children[0] = (BVHBuildNode *)0x0;
  ((BVHBuildNode *)local_460)->children[1] = (BVHBuildNode *)0x0;
  ((BVHBuildNode *)local_460)->splitAxis = 0;
  ((BVHBuildNode *)local_460)->firstPrimOffset = 0;
  *(undefined8 *)&((BVHBuildNode *)local_460)->nPrimitives = 0;
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       0xff7fffff7f7fffff;
  auVar174._8_4_ = 0xff7fffff;
  auVar174._0_8_ = &DAT_ff7fffffff7fffff;
  auVar174._12_4_ = 0xff7fffff;
  uVar7 = vmovlps_avx(auVar174);
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar7
  ;
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar7 >> 0x20);
  LOCK();
  ((__atomic_base<int> *)&local_470->_M_i)->_M_i =
       ((__atomic_base<int> *)&local_470->_M_i)->_M_i + 1;
  UNLOCK();
  lVar147 = (long)local_494;
  lVar142 = (long)local_498;
  if (local_494 < local_498) {
    pfVar151 = &(bvhPrimitives->
                super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl
                .super__Vector_impl_data._M_start[lVar147].bounds.pMax.
                super_Tuple3<pbrt::Point3,_float>.z;
    auVar183._8_4_ = 0x7f7fffff;
    auVar183._0_8_ = 0x7f7fffff7f7fffff;
    auVar183._12_4_ = 0x7f7fffff;
    lVar153 = lVar142 - lVar147;
    auVar174._8_4_ = 0xff7fffff;
    auVar174._0_8_ = &DAT_ff7fffffff7fffff;
    auVar174._12_4_ = 0xff7fffff;
    auVar180 = ZEXT464(0xff7fffff);
    auVar182 = ZEXT464(0x7f7fffff);
    do {
      auVar184._8_8_ = 0;
      auVar184._0_8_ = *(ulong *)(pfVar151 + -5);
      auVar183 = vminps_avx(auVar184,auVar183);
      auVar184 = vminss_avx(ZEXT416((uint)pfVar151[-3]),auVar182._0_16_);
      auVar182 = ZEXT1664(auVar184);
      uVar2 = ((Tuple3<pbrt::Point3,_float> *)(pfVar151 + -2))->x;
      uVar9 = ((Tuple3<pbrt::Point3,_float> *)(pfVar151 + -2))->y;
      auVar185._4_4_ = uVar9;
      auVar185._0_4_ = uVar2;
      auVar185._8_8_ = 0;
      auVar174 = vmaxps_avx(auVar185,auVar174);
      auVar184 = vmaxss_avx(ZEXT416((uint)*pfVar151),auVar180._0_16_);
      auVar180 = ZEXT1664(auVar184);
      pfVar151 = pfVar151 + 0xc;
      lVar153 = lVar153 + -1;
    } while (lVar153 != 0);
  }
  else {
    auVar182 = ZEXT464(0x7f7fffff);
    auVar180 = ZEXT464(0xff7fffff);
    auVar183._8_4_ = 0x7f7fffff;
    auVar183._0_8_ = 0x7f7fffff7f7fffff;
    auVar183._12_4_ = 0x7f7fffff;
  }
  uVar150 = local_498 - local_494;
  auVar185 = vsubps_avx(auVar174,auVar183);
  auVar184 = vmovshdup_avx(auVar185);
  fVar177 = auVar180._0_4_;
  fVar181 = auVar182._0_4_;
  auVar185 = vfmadd231ss_fma(ZEXT416((uint)(auVar185._0_4_ * (fVar177 - fVar181))),auVar184,auVar185
                            );
  auVar184 = vfmadd231ss_fma(auVar185,auVar184,ZEXT416((uint)(fVar177 - fVar181)));
  fVar168 = auVar184._0_4_ + auVar184._0_4_;
  if (((fVar168 == 0.0) && (!NAN(fVar168))) || (uVar150 == 1)) {
    LOCK();
    iVar141 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
    (orderedPrimsOffset->super___atomic_base<int>)._M_i =
         (orderedPrimsOffset->super___atomic_base<int>)._M_i + uVar150;
    UNLOCK();
    if (local_494 < local_498) {
      pPVar15 = (this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar16 = (orderedPrims->
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pBVar160 = (bvhPrimitives->
                 super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_494;
      lVar142 = (long)local_498 - (long)local_494;
      iVar161 = iVar141;
      do {
        pPVar16[iVar161].
        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        .bits = pPVar15[(int)pBVar160->primitiveIndex].
                super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                .bits;
        pBVar160 = pBVar160 + 1;
        iVar161 = iVar161 + 1;
        lVar142 = lVar142 + -1;
      } while (lVar142 != 0);
    }
  }
  else {
    if (local_494 < local_498) {
      pfVar151 = &(bvhPrimitives->
                  super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar147].centroid.
                  super_Tuple3<pbrt::Point3,_float>.z;
      auVar182 = ZEXT1664(CONCAT412(0xff7fffff,CONCAT48(0xff7fffff,&DAT_ff7fffffff7fffff)));
      lVar153 = lVar142 - lVar147;
      auVar188 = ZEXT464(0xff7fffff);
      auVar187 = ZEXT464(0x7f7fffff);
      auVar180 = ZEXT1664(CONCAT412(0x7f7fffff,CONCAT48(0x7f7fffff,0x7f7fffff7f7fffff)));
      do {
        auVar185 = vminss_avx(ZEXT416((uint)*pfVar151),auVar187._0_16_);
        auVar187 = ZEXT1664(auVar185);
        uVar3 = ((Tuple3<pbrt::Point3,_float> *)(pfVar151 + -2))->x;
        uVar10 = ((Tuple3<pbrt::Point3,_float> *)(pfVar151 + -2))->y;
        auVar172._4_4_ = uVar10;
        auVar172._0_4_ = uVar3;
        auVar172._8_8_ = 0;
        auVar184 = vminps_avx(auVar172,auVar180._0_16_);
        auVar180 = ZEXT1664(auVar184);
        auVar184 = vmaxps_avx(auVar172,auVar182._0_16_);
        auVar182 = ZEXT1664(auVar184);
        auVar184 = vmaxss_avx(ZEXT416((uint)*pfVar151),auVar188._0_16_);
        auVar188 = ZEXT1664(auVar184);
        pfVar151 = pfVar151 + 0xc;
        lVar153 = lVar153 + -1;
      } while (lVar153 != 0);
    }
    else {
      auVar180 = ZEXT1664(CONCAT412(0x7f7fffff,CONCAT48(0x7f7fffff,0x7f7fffff7f7fffff)));
      auVar185 = SUB6416(ZEXT464(0x7f7fffff),0);
      auVar182 = ZEXT1664(CONCAT412(0xff7fffff,CONCAT48(0xff7fffff,&DAT_ff7fffffff7fffff)));
      auVar184 = SUB6416(ZEXT464(0xff7fffff),0);
    }
    auVar176 = auVar180._0_16_;
    auVar178 = auVar182._0_16_;
    auVar175 = vsubps_avx(auVar178,auVar176);
    auVar172 = vmovshdup_avx(auVar175);
    fVar186 = auVar185._0_4_;
    fVar18 = auVar184._0_4_ - fVar186;
    uVar143 = vcmpps_avx512vl(auVar172,auVar175,1);
    uVar148 = vcmpps_avx512vl(ZEXT416((uint)fVar18),auVar175,1);
    __comp._M_comp.dim = (anon_class_4_1_ba1d3fe8)(anon_class_4_1_ba1d3fe8)0;
    if ((uVar143 & uVar148 & 1) == 0) {
      __comp._M_comp.dim =
           (anon_class_4_1_ba1d3fe8)(anon_class_4_1_ba1d3fe8)((auVar172._0_4_ <= fVar18) + 1);
    }
    iVar141 = (local_494 + local_498) / 2;
    auVar170._0_4_ = auVar182._0_4_;
    if ((__comp._M_comp.dim != 0) && (auVar170._0_4_ = auVar184._0_4_, __comp._M_comp.dim == 1)) {
      auVar172 = vmovshdup_avx(auVar178);
      auVar170._0_4_ = auVar172._0_4_;
    }
    auVar172 = auVar176;
    if ((__comp._M_comp.dim != 0) && (auVar172 = auVar185, __comp._M_comp.dim == 1)) {
      auVar172 = vmovshdup_avx(auVar176);
    }
    if ((auVar170._0_4_ != auVar172._0_4_) || (NAN(auVar170._0_4_) || NAN(auVar172._0_4_))) {
      local_49c = iVar141;
      local_480 = bvhPrimitives;
      local_458 = this;
      local_450 = threadAllocators;
      if (this->splitMethod != EqualCounts) {
        if (this->splitMethod != Middle) {
          if ((int)uVar150 < 3) {
            if (iVar141 != local_498 && local_494 != local_498) {
              pBVar149 = (bvhPrimitives->
                         super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              pBVar160 = pBVar149 + lVar147;
              pBVar145 = pBVar149 + lVar142;
              uVar143 = lVar142 * 0x30 + lVar147 * -0x30;
              if ((long)uVar143 < 0x91) {
LAB_003f212f:
                if ((pBVar160 != pBVar145) && (pBVar160 + 1 != pBVar145)) {
                  local_490 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  local_488 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  pfVar151 = &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                  pBVar149 = pBVar160 + 1;
                  pBVar156 = pBVar160;
                  do {
                    pBVar152 = pBVar149;
                    if (__comp._M_comp.dim == 0) {
                      pPVar144 = &pBVar156[1].centroid;
                    }
                    else if (__comp._M_comp.dim == 1) {
                      pPVar144 = (Point3f *)
                                 &pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                    }
                    else {
                      pPVar144 = (Point3f *)
                                 &pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                    }
                    pBVar149 = (pointer)&pBVar160->centroid;
                    if ((__comp._M_comp.dim != 0) && (pBVar149 = local_490, __comp._M_comp.dim != 1)
                       ) {
                      pBVar149 = local_488;
                    }
                    if (((Tuple3<pbrt::Point3,_float> *)&pBVar149->primitiveIndex)->x <=
                        (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) {
                      sVar20 = pBVar152->primitiveIndex;
                      uVar8._0_4_ = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar8._4_4_ = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar7 = *(undefined8 *)
                               &(pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar117._0_4_ = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar117._4_4_ = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      local_448._0_4_ = (undefined4)sVar20;
                      local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                      uStack_438 = (undefined4)uVar7;
                      uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                      uVar148._0_4_ = pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar148._4_4_ = pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                      auVar176._8_8_ = 0;
                      auVar176._0_8_ = uVar148;
                      auVar174 = vmovshdup_avx(auVar176);
                      fVar168 = pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                      pfVar146 = pfVar151;
                      pBVar149 = pBVar152;
                      while( true ) {
                        fVar177 = (float)(undefined4)uVar148;
                        if ((__comp._M_comp.dim != 0) &&
                           (fVar177 = auVar174._0_4_, __comp._M_comp.dim != 1)) {
                          fVar177 = fVar168;
                        }
                        if (__comp._M_comp.dim == 0) {
                          pPVar144 = &pBVar149[-1].centroid;
                        }
                        else if (__comp._M_comp.dim == 1) {
                          pPVar144 = (Point3f *)
                                     &pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar144 = (Point3f *)(pfVar146 + -0xc);
                        }
                        if ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <= fVar177) break;
                        pBVar149 = pBVar149 + -1;
                        *(undefined8 *)(pfVar146 + -7) = *(undefined8 *)(pfVar146 + -0x13);
                        *(undefined8 *)(pfVar146 + -5) = *(undefined8 *)(pfVar146 + -0x11);
                        *(undefined8 *)(pfVar146 + -3) = *(undefined8 *)(pfVar146 + -0xf);
                        *(undefined8 *)(pfVar146 + -1) = *(undefined8 *)(pfVar146 + -0xd);
                        *(undefined8 *)(pfVar146 + -10) = *(undefined8 *)(pfVar146 + -0x16);
                        *(undefined8 *)(pfVar146 + -8) = *(undefined8 *)(pfVar146 + -0x14);
                        *(undefined8 *)(pfVar146 + -6) = *(undefined8 *)(pfVar146 + -0x12);
                        *(undefined8 *)(pfVar146 + -4) = *(undefined8 *)(pfVar146 + -0x10);
                        pfVar146 = pfVar146 + -0xc;
                      }
                      *(size_t *)(pfVar146 + -10) = sVar20;
                      *(undefined8 *)(pfVar146 + -8) = uVar8;
                      *(undefined8 *)(pfVar146 + -6) = uVar7;
                      *(undefined8 *)(pfVar146 + -4) = uVar117;
                      uVar7 = vmovlps_avx(auVar176);
                      ((Tuple3<pbrt::Point3,_float> *)(pfVar146 + -2))->x = (float)(int)uVar7;
                      ((Tuple3<pbrt::Point3,_float> *)(pfVar146 + -2))->y =
                           (float)(int)((ulong)uVar7 >> 0x20);
                      *pfVar146 = fVar168;
                      local_448._8_4_ = (undefined4)uVar8;
                      local_448._12_4_ = uVar8._4_4_;
                      auStack_430[0] = (undefined4)uVar117;
                      auStack_430[1] = uVar117._4_4_;
                    }
                    else {
                      uVar111 = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar112 = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar7 = *(undefined8 *)
                               &(pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar113 = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar114 = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar115 = (pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                      uVar116 = (pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &(pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                      uStack_420 = (undefined4)uVar8;
                      uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                      local_448._0_4_ = (undefined4)pBVar152->primitiveIndex;
                      local_448._4_4_ = (undefined4)(pBVar152->primitiveIndex >> 0x20);
                      uStack_438 = (undefined4)uVar7;
                      uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                      local_448._8_4_ = uVar111;
                      local_448._12_4_ = uVar112;
                      auStack_430[0] = uVar113;
                      auStack_430[1] = uVar114;
                      auStack_430[2] = uVar115;
                      auStack_430[3] = uVar116;
                      memmove((void *)((long)pBVar156 + (0x60 - ((long)pBVar152 - (long)pBVar160))),
                              pBVar160,(long)pBVar152 - (long)pBVar160);
                      pBVar160->primitiveIndex = CONCAT44(local_448._4_4_,local_448._0_4_);
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
                           (float)local_448._8_4_;
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                           (float)local_448._12_4_;
                      *(ulong *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           CONCAT44(uStack_434,uStack_438);
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
                           (float)auStack_430[0];
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           (float)auStack_430[1];
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                           (float)local_448._12_4_;
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           (float)uStack_438;
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x =
                           (float)uStack_434;
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
                           (float)auStack_430[0];
                      *(ulong *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           CONCAT44(auStack_430[2],auStack_430[1]);
                      (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y =
                           (float)auStack_430[3];
                      (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                    }
                    pfVar151 = pfVar151 + 0xc;
                    pBVar149 = pBVar152 + 1;
                    pBVar156 = pBVar152;
                  } while (pBVar152 + 1 != pBVar145);
                }
              }
              else {
                pBVar149 = pBVar149 + iVar141;
                lVar142 = LZCOUNT((uVar143 >> 4) * -0x5555555555555555);
                if (lVar142 != 0x3f) {
                  uVar148 = (ulong)(uint)((int)lVar142 * 2) ^ 0x7e;
                  do {
                    pPVar144 = &pBVar160[1].centroid;
                    pPVar154 = pPVar144;
                    if (__comp._M_comp.dim != 0) {
                      if (__comp._M_comp.dim == 1) {
                        pPVar154 = (Point3f *)
                                   &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                      }
                      else {
                        pPVar154 = (Point3f *)
                                   &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                      }
                    }
                    pBVar156 = pBVar160 + uVar143 / 0x60;
                    pPVar162 = &pBVar156->centroid;
                    pPVar164 = pPVar162;
                    if (__comp._M_comp.dim != 0) {
                      if (__comp._M_comp.dim == 1) {
                        pPVar164 = (Point3f *)
                                   &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                      }
                      else {
                        pPVar164 = (Point3f *)
                                   &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                      }
                    }
                    pBVar152 = pBVar160 + 1;
                    if ((pPVar164->super_Tuple3<pbrt::Point3,_float>).x <=
                        (pPVar154->super_Tuple3<pbrt::Point3,_float>).x) {
                      if (__comp._M_comp.dim != 0) {
                        if (__comp._M_comp.dim == 1) {
                          pPVar144 = (Point3f *)
                                     &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar144 = (Point3f *)
                                     &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                        }
                      }
                      pPVar154 = &pBVar145[-1].centroid;
                      pPVar164 = pPVar154;
                      if (__comp._M_comp.dim != 0) {
                        if (__comp._M_comp.dim == 1) {
                          pPVar164 = (Point3f *)
                                     &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar164 = (Point3f *)
                                     &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                        }
                      }
                      if ((pPVar164->super_Tuple3<pbrt::Point3,_float>).x <=
                          (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) {
                        if (__comp._M_comp.dim != 0) {
                          if (__comp._M_comp.dim == 1) {
                            pPVar162 = (Point3f *)
                                       &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                          }
                          else {
                            pPVar162 = (Point3f *)
                                       &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                          }
                        }
                        if (__comp._M_comp.dim != 0) {
                          if (__comp._M_comp.dim == 1) {
                            pPVar154 = (Point3f *)
                                       &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                          }
                          else {
                            pPVar154 = (Point3f *)
                                       &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                          }
                        }
                        if ((pPVar162->super_Tuple3<pbrt::Point3,_float>).x <
                            (pPVar154->super_Tuple3<pbrt::Point3,_float>).x) goto LAB_003f0fe2;
                        goto LAB_003f1032;
                      }
LAB_003f0f7f:
                      sVar20 = pBVar160->primitiveIndex;
                      uVar21 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar22 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar7 = *(undefined8 *)
                               &(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar23 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar24 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar25 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                      uVar26 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                      uStack_420 = (undefined4)uVar8;
                      uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                      local_448._0_4_ = (undefined4)sVar20;
                      local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                      uStack_438 = (undefined4)uVar7;
                      uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                      sVar27 = pBVar152->primitiveIndex;
                      auVar170._0_4_ = pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      fVar136 = pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar137 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      fVar138 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar168 = pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar177 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                      fVar181 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar28 = *(undefined8 *)
                                &pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar18 = pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                      fVar186 = pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                           pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                      *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar28;
                      (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                      (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                      pBVar160->primitiveIndex = sVar27;
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                      (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                      *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar8;
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                      (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                      uVar8 = CONCAT44(uVar25,uVar24);
                      pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar22;
                      pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           (float)uStack_438;
                      pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                           (float)uStack_434;
                      pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar23;
                      *(undefined8 *)&pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar8;
                      pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar26;
                      pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                      pBVar152->primitiveIndex = sVar20;
                      pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar21;
                      pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar22;
                      *(undefined8 *)&pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar7;
                      pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar23;
                      pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar24;
                      local_448._8_4_ = uVar21;
                      local_448._12_4_ = uVar22;
                      auStack_430[0] = uVar23;
                      auStack_430[1] = uVar24;
                      auStack_430[2] = uVar25;
                      auStack_430[3] = uVar26;
                    }
                    else {
                      if (__comp._M_comp.dim != 0) {
                        if (__comp._M_comp.dim == 1) {
                          pPVar162 = (Point3f *)
                                     &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar162 = (Point3f *)
                                     &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                        }
                      }
                      pPVar154 = &pBVar145[-1].centroid;
                      pPVar164 = pPVar154;
                      if (__comp._M_comp.dim != 0) {
                        if (__comp._M_comp.dim == 1) {
                          pPVar164 = (Point3f *)
                                     &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar164 = (Point3f *)
                                     &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                        }
                      }
                      if ((pPVar162->super_Tuple3<pbrt::Point3,_float>).x <
                          (pPVar164->super_Tuple3<pbrt::Point3,_float>).x) {
LAB_003f1032:
                        sVar20 = pBVar160->primitiveIndex;
                        uVar35 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                        uVar36 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar7 = *(undefined8 *)
                                 &(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                        uVar37 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar38 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                        uVar39 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                        uVar40 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                        uVar8 = *(undefined8 *)
                                 &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                        uStack_420 = (undefined4)uVar8;
                        uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                        local_448._0_4_ = (undefined4)sVar20;
                        local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                        uStack_438 = (undefined4)uVar7;
                        uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                        sVar27 = pBVar156->primitiveIndex;
                        auVar170._0_4_ = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x
                        ;
                        fVar136 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar8 = *(undefined8 *)
                                 &(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar137 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                        fVar138 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar168 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar177 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
                        fVar181 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar28 = *(undefined8 *)
                                  &(pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar18 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                        fVar186 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                             (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                        *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar28;
                        (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                        (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                        pBVar160->primitiveIndex = sVar27;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_
                        ;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                        *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar8;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                        uVar8 = CONCAT44(uVar39,uVar38);
                        (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar36;
                        (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                             (float)uStack_438;
                        (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x =
                             (float)uStack_434;
                        (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar37;
                        *(undefined8 *)&(pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar8;
                        (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar40;
                        (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420
                        ;
                        pBVar156->primitiveIndex = sVar20;
                        (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar35;
                        (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar36;
                        *(undefined8 *)&(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar7;
                        (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar37;
                        (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar38;
                        local_448._8_4_ = uVar35;
                        local_448._12_4_ = uVar36;
                        auStack_430[0] = uVar37;
                        auStack_430[1] = uVar38;
                        auStack_430[2] = uVar39;
                        auStack_430[3] = uVar40;
                      }
                      else {
                        if (__comp._M_comp.dim != 0) {
                          if (__comp._M_comp.dim == 1) {
                            pPVar144 = (Point3f *)
                                       &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                          }
                          else {
                            pPVar144 = (Point3f *)
                                       &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                          }
                        }
                        if (__comp._M_comp.dim != 0) {
                          if (__comp._M_comp.dim == 1) {
                            pPVar154 = (Point3f *)
                                       &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                          }
                          else {
                            pPVar154 = (Point3f *)
                                       &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                          }
                        }
                        if ((pPVar154->super_Tuple3<pbrt::Point3,_float>).x <=
                            (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) goto LAB_003f0f7f;
LAB_003f0fe2:
                        sVar20 = pBVar160->primitiveIndex;
                        uVar29 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                        uVar30 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar7 = *(undefined8 *)
                                 &(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                        uVar31 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar32 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                        uVar33 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                        uVar34 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                        uVar8 = *(undefined8 *)
                                 &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                        uStack_420 = (undefined4)uVar8;
                        uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                        local_448._0_4_ = (undefined4)sVar20;
                        local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                        uStack_438 = (undefined4)uVar7;
                        uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                        sVar27 = pBVar145[-1].primitiveIndex;
                        auVar170._0_4_ =
                             pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                        fVar136 = pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar8 = *(undefined8 *)
                                 &pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar137 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                        fVar138 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar168 = pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar177 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                        fVar181 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                        uVar28 = *(undefined8 *)
                                  &pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                        fVar18 = pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                        fVar186 = pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                             pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                        *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar28;
                        (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                        (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                        pBVar160->primitiveIndex = sVar27;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_
                        ;
                        (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                        *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar8;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                        (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                        uVar8 = CONCAT44(uVar33,uVar32);
                        pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar30
                        ;
                        pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                             (float)uStack_438;
                        pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                             (float)uStack_434;
                        pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar31
                        ;
                        *(undefined8 *)&pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar8;
                        pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar34;
                        pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z =
                             (float)uStack_420;
                        pBVar145[-1].primitiveIndex = sVar20;
                        pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar29
                        ;
                        pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar30
                        ;
                        *(undefined8 *)&pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z
                             = uVar7;
                        pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar31
                        ;
                        pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar32
                        ;
                        local_448._8_4_ = uVar29;
                        local_448._12_4_ = uVar30;
                        auStack_430[0] = uVar31;
                        auStack_430[1] = uVar32;
                        auStack_430[2] = uVar33;
                        auStack_430[3] = uVar34;
                      }
                    }
                    uVar148 = uVar148 - 1;
                    pfVar151 = &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                    pfVar146 = &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                    pBVar156 = pBVar145;
                    while( true ) {
                      pBVar166 = pBVar152 + -1;
                      do {
                        pBVar165 = pBVar166;
                        if (__comp._M_comp.dim == 0) {
                          pPVar144 = &pBVar152->centroid;
                        }
                        else if (__comp._M_comp.dim == 1) {
                          pPVar144 = (Point3f *)
                                     &(pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar144 = (Point3f *)
                                     &pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                        }
                        pPVar154 = &pBVar160->centroid;
                        if ((__comp._M_comp.dim != 0) &&
                           (pPVar154 = (Point3f *)pfVar151, __comp._M_comp.dim != 1)) {
                          pPVar154 = (Point3f *)pfVar146;
                        }
                        pBVar152 = pBVar152 + 1;
                        pBVar166 = pBVar165 + 1;
                      } while ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <
                               (pPVar154->super_Tuple3<pbrt::Point3,_float>).x);
                      pBVar152 = pBVar165 + 2;
                      do {
                        pBVar163 = pBVar156;
                        pPVar144 = &pBVar160->centroid;
                        if ((__comp._M_comp.dim != 0) &&
                           (pPVar144 = (Point3f *)pfVar151, __comp._M_comp.dim != 1)) {
                          pPVar144 = (Point3f *)pfVar146;
                        }
                        if (__comp._M_comp.dim == 0) {
                          pPVar154 = &pBVar163[-1].centroid;
                        }
                        else if (__comp._M_comp.dim == 1) {
                          pPVar154 = (Point3f *)
                                     &pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                        }
                        else {
                          pPVar154 = (Point3f *)
                                     &pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                        }
                        pBVar156 = pBVar163 + -1;
                      } while ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <
                               (pPVar154->super_Tuple3<pbrt::Point3,_float>).x);
                      if (pBVar156 <= pBVar166) break;
                      sVar20 = pBVar166->primitiveIndex;
                      uVar41 = pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar42 = pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar7 = *(undefined8 *)
                               &pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar43 = pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar44 = pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar45 = pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar46 = pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                      uStack_420 = (undefined4)uVar8;
                      uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                      local_448._0_4_ = (undefined4)sVar20;
                      local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                      uStack_438 = (undefined4)uVar7;
                      uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                      sVar27 = pBVar156->primitiveIndex;
                      auVar170._0_4_ = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      fVar136 = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar137 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      fVar138 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar168 = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar177 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                      fVar181 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar28 = *(undefined8 *)
                                &pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar18 = pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                      fVar186 = pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                      pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                           pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                      pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                      pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                      *(undefined8 *)&pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar28;
                      pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                      pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                      pBVar166->primitiveIndex = sVar27;
                      pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                      pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                      *(undefined8 *)&pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar8;
                      pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                      pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                      uVar8 = CONCAT44(uVar45,uVar44);
                      pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar42;
                      pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           (float)uStack_438;
                      pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                           (float)uStack_434;
                      pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar43;
                      *(undefined8 *)&pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar8;
                      pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar46;
                      pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                      pBVar156->primitiveIndex = sVar20;
                      pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar41;
                      pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar42;
                      *(undefined8 *)&pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar7;
                      pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar43;
                      pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar44;
                      local_448._8_4_ = uVar41;
                      local_448._12_4_ = uVar42;
                      auStack_430[0] = uVar43;
                      auStack_430[1] = uVar44;
                      auStack_430[2] = uVar45;
                      auStack_430[3] = uVar46;
                    }
                    if (pBVar166 <= pBVar149) {
                      pBVar160 = pBVar166;
                      pBVar166 = pBVar145;
                    }
                    pBVar145 = pBVar166;
                    uVar143 = (long)pBVar145 - (long)pBVar160;
                    if ((long)uVar143 < 0x91) goto LAB_003f212f;
                  } while (uVar148 != 0);
                }
                pBVar156 = pBVar149 + 1;
                lVar142 = ((long)pBVar156 - (long)pBVar160 >> 4) * -0x5555555555555555;
                local_490 = pBVar145;
                local_468 = pBVar149;
                if (0x5f < (long)pBVar156 - (long)pBVar160) {
                  uVar143 = lVar142 - 2U >> 1;
                  do {
                    pBVar1 = pBVar160 + uVar143;
                    uVar124 = pBVar1->primitiveIndex;
                    auVar125 = *(undefined1 (*) [12])&(pBVar1->bounds).pMin;
                    auVar126 = *(undefined1 (*) [12])&(pBVar1->bounds).pMax;
                    __value.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                         (Tuple3<pbrt::Point3,_float>)auVar126;
                    __value.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                         (Tuple3<pbrt::Point3,_float>)auVar125;
                    __value.primitiveIndex = uVar124;
                    __value._32_16_ =
                         SUB3216(*(undefined1 (*) [32])
                                  &pBVar160[uVar143].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z
                                 ,0x10);
                    std::
                    __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>>
                              (pBVar160,uVar143,lVar142,__value,__comp);
                    bVar167 = uVar143 != 0;
                    uVar143 = uVar143 - 1;
                  } while (bVar167);
                }
                pBVar145 = local_468;
                if (pBVar156 < local_490) {
                  local_488 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  local_478 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  do {
                    if (__comp._M_comp.dim == 0) {
                      pPVar144 = &pBVar156->centroid;
                    }
                    else if (__comp._M_comp.dim == 1) {
                      pPVar144 = (Point3f *)
                                 &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                    }
                    else {
                      pPVar144 = (Point3f *)
                                 &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                    }
                    pBVar149 = (pointer)&pBVar160->centroid;
                    if ((__comp._M_comp.dim != 0) && (pBVar149 = local_488, __comp._M_comp.dim != 1)
                       ) {
                      pBVar149 = local_478;
                    }
                    if ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <
                        ((Tuple3<pbrt::Point3,_float> *)&pBVar149->primitiveIndex)->x) {
                      uVar47 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      uVar48 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      pfVar151 = &(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar7 = *(undefined8 *)pfVar151;
                      uVar49 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar50 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar130 = pBVar156->primitiveIndex;
                      auVar131 = *(undefined1 (*) [12])&(pBVar156->bounds).pMin;
                      auVar132 = *(undefined1 (*) [12])&(pBVar156->bounds).pMax;
                      __value_00.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                           (Tuple3<pbrt::Point3,_float>)auVar132;
                      __value_00.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                           (Tuple3<pbrt::Point3,_float>)auVar131;
                      __value_00.primitiveIndex = uVar130;
                      auVar121 = *(undefined1 (*) [12])pfVar151;
                      uVar51 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                      uVar52 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                      uStack_420 = (undefined4)uVar8;
                      uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                      local_448._0_4_ = (undefined4)pBVar156->primitiveIndex;
                      local_448._4_4_ = (undefined4)(pBVar156->primitiveIndex >> 0x20);
                      uStack_438 = (undefined4)uVar7;
                      uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                      sVar20 = pBVar160->primitiveIndex;
                      auVar170._0_4_ = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                      fVar136 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar7 = *(undefined8 *)
                               &(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar137 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      fVar138 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar168 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar177 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
                      fVar181 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar8 = *(undefined8 *)
                               &(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                      fVar18 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                      fVar186 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                      (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                           (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                      (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                      (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                      (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                      *(undefined8 *)&(pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar8;
                      (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                      (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                      pBVar156->primitiveIndex = sVar20;
                      (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                      (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                      *(undefined8 *)&(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                           uVar7;
                      (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                      (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                      auVar119._12_4_ = uVar50;
                      auVar119._0_12_ = auVar121;
                      auVar119._16_4_ = uVar51;
                      auVar119._20_4_ = uVar52;
                      auVar119._24_4_ = uStack_420;
                      auVar119._28_4_ = uStack_41c;
                      __value_00._32_16_ = auVar119._16_16_;
                      local_448._8_4_ = uVar47;
                      local_448._12_4_ = uVar48;
                      auStack_430[0] = uVar49;
                      auStack_430[1] = uVar50;
                      auStack_430[2] = uVar51;
                      auStack_430[3] = uVar52;
                      std::
                      __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>>
                                (pBVar160,0,lVar142,__value_00,__comp);
                    }
                    pBVar156 = pBVar156 + 1;
                  } while (pBVar156 < local_490);
                }
                sVar20 = pBVar160->primitiveIndex;
                uVar53 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar54 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar7 = *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar55 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar56 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar57 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar58 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar8;
                uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._0_4_ = (undefined4)sVar20;
                local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                uStack_438 = (undefined4)uVar7;
                uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                sVar27 = pBVar145->primitiveIndex;
                auVar170._0_4_ = (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                fVar136 = (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar137 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                fVar138 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar168 = (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar177 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
                fVar181 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar28 = *(undefined8 *)&(pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z
                ;
                fVar18 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                fVar186 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar28
                ;
                (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                pBVar160->primitiveIndex = sVar27;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                uVar8 = CONCAT44(uVar57,uVar56);
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar54;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar55;
                *(undefined8 *)&(pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar58;
                (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                pBVar145->primitiveIndex = sVar20;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar53;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar54;
                *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar55;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar56;
                local_448._8_4_ = uVar53;
                local_448._12_4_ = uVar54;
                auStack_430[0] = uVar55;
                auStack_430[1] = uVar56;
                auStack_430[2] = uVar57;
                auStack_430[3] = uVar58;
              }
            }
            goto LAB_003f229f;
          }
          lVar153 = 0;
          auVar173._8_4_ = 0xff7fffff;
          auVar173._0_8_ = &DAT_ff7fffffff7fffff;
          auVar173._12_4_ = 0xff7fffff;
          do {
            *(undefined8 *)(local_448 + lVar153 + 0xc) = 0;
            *(undefined8 *)((long)&uStack_434 + lVar153) = 0;
            *(undefined8 *)(local_448 + lVar153) = 0;
            *(undefined8 *)(local_448 + lVar153 + 8) = 0;
            *(undefined8 *)(local_448 + lVar153 + 4) = 0x7f7fffff7f7fffff;
            *(undefined8 *)(local_448 + lVar153 + 0xc) = 0xff7fffff7f7fffff;
            uVar7 = vmovlps_avx(auVar173);
            *(undefined8 *)((long)&uStack_434 + lVar153) = uVar7;
            lVar153 = lVar153 + 0x1c;
          } while (lVar153 != 0x150);
          if (local_494 < local_498) {
            pfVar151 = &(bvhPrimitives->
                        super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)
                        ._M_impl.super__Vector_impl_data._M_start[lVar147].centroid.
                        super_Tuple3<pbrt::Point3,_float>.z;
            lVar153 = lVar142 - lVar147;
            uVar143 = vcmpps_avx512vl(auVar176,auVar178,1);
            uVar7 = vcmpss_avx512f(auVar185,auVar184,1);
            bVar167 = (bool)((byte)uVar7 & 1);
            do {
              uVar4 = ((Tuple3<pbrt::Point3,_float> *)(pfVar151 + -2))->x;
              uVar11 = ((Tuple3<pbrt::Point3,_float> *)(pfVar151 + -2))->y;
              auVar169._4_4_ = uVar11;
              auVar169._0_4_ = uVar4;
              auVar169._8_8_ = 0;
              auVar172 = vsubps_avx(auVar169,auVar176);
              auVar169 = vdivps_avx512vl(auVar172,auVar175);
              bVar17 = (bool)((byte)uVar143 & 1);
              auVar170._0_4_ =
                   (float)((uint)bVar17 * auVar169._0_4_ | (uint)!bVar17 * auVar172._0_4_);
              bVar17 = (bool)((byte)(uVar143 >> 1) & 1);
              auVar170._4_4_ = (uint)bVar17 * auVar169._4_4_ | (uint)!bVar17 * auVar172._4_4_;
              bVar17 = (bool)((byte)(uVar143 >> 2) & 1);
              auVar170._8_4_ = (uint)bVar17 * auVar169._8_4_ | (uint)!bVar17 * auVar172._8_4_;
              bVar17 = (bool)((byte)(uVar143 >> 3) & 1);
              auVar170._12_4_ = (uint)bVar17 * auVar169._12_4_ | (uint)!bVar17 * auVar172._12_4_;
              if (__comp._M_comp.dim != 0) {
                if (__comp._M_comp.dim == 1) {
                  auVar172 = vmovshdup_avx(auVar170);
                  auVar170._0_4_ = auVar172._0_4_;
                }
                else {
                  auVar170._0_4_ =
                       (float)((uint)bVar167 * (int)((*pfVar151 - fVar186) / fVar18) +
                              (uint)!bVar167 * (int)(*pfVar151 - fVar186));
                }
              }
              iVar141 = 0xb;
              if ((int)(auVar170._0_4_ * 12.0) != 0xc) {
                iVar141 = (int)(auVar170._0_4_ * 12.0);
              }
              lVar157 = (long)iVar141;
              lVar19 = lVar157 * 0x1c;
              *(int *)(local_448 + lVar19) = *(int *)(local_448 + lVar19) + 1;
              auVar171._8_8_ = 0;
              auVar171._0_8_ = *(ulong *)(pfVar151 + -8);
              auVar198._8_8_ = 0;
              auVar198._0_8_ = *(ulong *)(local_448 + lVar19 + 4);
              auVar172 = vminps_avx(auVar171,auVar198);
              auVar199._8_8_ = 0;
              auVar199._0_8_ = *(ulong *)(&uStack_438 + lVar157 * 7);
              auVar170 = vminss_avx512f(ZEXT416((uint)pfVar151[-6]),
                                        ZEXT416(*(uint *)(local_448 + lVar157 * 0x1c + 0xc)));
              auVar200._8_8_ = 0;
              auVar200._0_8_ = *(ulong *)(pfVar151 + -5);
              auVar169 = vmaxps_avx512vl(auVar200,auVar199);
              auVar171 = vmaxss_avx512f(ZEXT416((uint)pfVar151[-3]),
                                        ZEXT416(auStack_430[lVar157 * 7]));
              uVar7 = vmovlps_avx(auVar172);
              *(undefined8 *)(local_448 + lVar19 + 4) = uVar7;
              *(int *)(local_448 + lVar157 * 0x1c + 0xc) = auVar170._0_4_;
              uVar7 = vmovlps_avx(auVar169);
              *(undefined8 *)(&uStack_438 + lVar157 * 7) = uVar7;
              auStack_430[lVar157 * 7] = auVar171._0_4_;
              pfVar151 = pfVar151 + 0xc;
              lVar153 = lVar153 + -1;
            } while (lVar153 != 0);
          }
          lVar153 = 0;
          do {
            *(undefined8 *)((long)local_2a8 + lVar153) = 0x7f7fffff7f7fffff;
            *(undefined8 *)((long)local_2a8 + lVar153 + 8) = 0xff7fffff7f7fffff;
            uVar7 = vmovlps_avx(auVar173);
            *(undefined8 *)((long)local_2a8 + lVar153 + 0x10) = uVar7;
            lVar153 = lVar153 + 0x18;
          } while (lVar153 != 0x108);
          lVar153 = 0;
          do {
            *(undefined8 *)((long)auStack_138 + lVar153) = 0x7f7fffff7f7fffff;
            *(undefined8 *)((long)auStack_138 + lVar153 + 8) = 0xff7fffff7f7fffff;
            uVar7 = vmovlps_avx(auVar173);
            *(undefined8 *)((long)auStack_138 + lVar153 + 0x10) = uVar7;
            lVar153 = lVar153 + 0x18;
          } while (lVar153 != 0x108);
          piVar155 = aiStack_198 + 0xd;
          aiStack_198[0xc] = local_448._0_4_;
          local_2a8[0] = (BVHBuildNode *)CONCAT44(local_448._8_4_,local_448._4_4_);
          local_2a8[1] = (BVHBuildNode *)CONCAT44(uStack_438,local_448._12_4_);
          puVar158 = local_27c;
          lVar153 = 0xd;
          iVar141 = local_448._0_4_;
          do {
            iVar141 = iVar141 + *(int *)(local_460 + lVar153 * 4);
            *piVar155 = iVar141;
            auVar189._8_8_ = 0;
            auVar189._0_8_ = *(ulong *)(local_460 + lVar153 * 4 + 4);
            auVar191._8_8_ = 0;
            auVar191._0_8_ = *(ulong *)(puVar158 + -0xb);
            auVar173 = vminps_avx(auVar189,auVar191);
            auVar192._8_8_ = 0;
            auVar192._0_8_ = *(ulong *)(puVar158 + -8);
            auVar169 = vminss_avx(ZEXT416(*(uint *)((long)&local_458 + lVar153 * 4 + 4)),
                                  ZEXT416((uint)puVar158[-9]));
            auVar196._8_8_ = 0;
            auVar196._0_8_ = *(ulong *)((long)&local_450 + lVar153 * 4);
            auVar172 = vmaxps_avx(auVar196,auVar192);
            auVar170 = vmaxss_avx(ZEXT416(*(uint *)(local_448 + lVar153 * 4)),
                                  ZEXT416((uint)puVar158[-6]));
            uVar7 = vmovlps_avx(auVar173);
            *(undefined8 *)(puVar158 + -5) = uVar7;
            puVar158[-3] = auVar169._0_4_;
            uVar7 = vmovlps_avx(auVar172);
            *(undefined8 *)(puVar158 + -2) = uVar7;
            *puVar158 = auVar170._0_4_;
            puVar158 = puVar158 + 6;
            piVar155 = piVar155 + 1;
            lVar153 = lVar153 + 7;
          } while (lVar153 != 0x53);
          piVar155 = aiStack_198 + 9;
          aiStack_198[10] = local_314;
          puVar159 = (uint *)((long)&uStack_38 + 4);
          local_48 = local_310;
          uStack_40 = uStack_308;
          uStack_38 = local_300;
          lVar153 = 0x118;
          do {
            local_314 = local_314 + *(int *)(local_448 + lVar153);
            *piVar155 = local_314;
            auVar190._8_8_ = 0;
            auVar190._0_8_ = *(ulong *)(local_448 + lVar153 + 4);
            auVar193._8_8_ = 0;
            auVar193._0_8_ = *(ulong *)(puVar159 + -5);
            auVar173 = vminps_avx(auVar190,auVar193);
            auVar194._8_8_ = 0;
            auVar194._0_8_ = *(ulong *)(puVar159 + -2);
            auVar169 = vminss_avx(ZEXT416(*(uint *)(local_448 + lVar153 + 0xc)),
                                  ZEXT416(puVar159[-3]));
            auVar197._8_8_ = 0;
            auVar197._0_8_ = *(ulong *)((long)&uStack_438 + lVar153);
            auVar172 = vmaxps_avx(auVar197,auVar194);
            auVar170 = vmaxss_avx(ZEXT416(*(uint *)((long)auStack_430 + lVar153)),ZEXT416(*puVar159)
                                 );
            uVar7 = vmovlps_avx(auVar173);
            *(undefined8 *)(puVar159 + -0xb) = uVar7;
            puVar159[-9] = auVar169._0_4_;
            uVar7 = vmovlps_avx(auVar172);
            *(undefined8 *)(puVar159 + -8) = uVar7;
            puVar159[-6] = auVar170._0_4_;
            puVar159 = puVar159 + -6;
            piVar155 = piVar155 + -1;
            lVar153 = lVar153 + -0x1c;
          } while (lVar153 != 0);
          uVar143 = 0xffffffff;
          auVar180 = ZEXT464(0x7f800000);
          lVar153 = 0x14;
          uVar148 = 0;
          do {
            if ((aiStack_198[uVar148 + 0xc] != 0) && (aiStack_198[uVar148] != 0)) {
              auVar195._0_4_ = (float)aiStack_198[uVar148 + 0xc];
              auVar195._4_12_ = auVar174._4_12_;
              auVar170 = ZEXT416((uint)(*(float *)((long)afStack_2bc + lVar153 + 0xc) -
                                       *(float *)((long)afStack_2bc + lVar153)));
              auVar169 = ZEXT416((uint)(*(float *)((long)local_2a8 + lVar153) -
                                       *(float *)((long)afStack_2bc + lVar153 + 8)));
              auVar172 = vmulss_avx512f(auVar170,auVar169);
              auVar173 = ZEXT416((uint)(*(float *)((long)afStack_2bc + lVar153 + 0x10) -
                                       *(float *)((long)afStack_2bc + lVar153 + 4)));
              auVar172 = vfmadd231ss_avx512f(auVar172,auVar173,auVar170);
              auVar172 = vfmadd231ss_avx512f(auVar172,auVar173,auVar169);
              auVar172 = vaddss_avx512f(auVar172,auVar172);
              auVar170 = vsubss_avx512f(ZEXT416(*(uint *)((long)&uStack_13c + lVar153)),
                                        ZEXT416(*(uint *)((long)auStack_148 + lVar153)));
              auVar173 = vsubss_avx512f(ZEXT416(*(uint *)((long)auStack_138 + lVar153)),
                                        ZEXT416(*(uint *)((long)auStack_148 + lVar153 + 4)));
              auVar171 = ZEXT416((uint)(*(float *)((long)&fStack_140 + lVar153) -
                                       *(float *)((long)&fStack_14c + lVar153)));
              auVar169 = vmulss_avx512f(auVar171,auVar173);
              auVar169 = vfmadd231ss_avx512f(auVar169,auVar170,auVar171);
              auVar170 = vfmadd231ss_avx512f(auVar169,auVar170,auVar173);
              auVar170 = vaddss_avx512f(auVar170,auVar170);
              auVar172 = vfmadd231ss_fma(ZEXT416((uint)(auVar170._0_4_ * (float)aiStack_198[uVar148]
                                                       )),auVar195,auVar172);
              if (auVar172._0_4_ < auVar180._0_4_) {
                uVar143 = uVar148 & 0xffffffff;
              }
              auVar172 = vminss_avx(auVar172,auVar180._0_16_);
              auVar180 = ZEXT1664(auVar172);
            }
            uVar148 = uVar148 + 1;
            lVar153 = lVar153 + 0x18;
          } while (uVar148 != 0xb);
          if ((this->maxPrimsInNode < (int)uVar150) ||
             (auVar180._0_4_ / fVar168 + 0.5 < (float)(int)uVar150)) {
            pBVar160 = (bvhPrimitives->
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            pBVar145 = pBVar160 + lVar147;
            if (local_494 != local_498) {
              pBVar160 = pBVar160 + lVar142;
              uVar148 = vcmpps_avx512vl(auVar176,auVar178,1);
              uVar7 = vcmpss_avx512f(auVar185,auVar184,1);
              bVar167 = (bool)((byte)uVar7 & 1);
              pBVar149 = pBVar145;
              do {
                while( true ) {
                  pBVar145 = pBVar149;
                  uVar5 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                  uVar12 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  auVar178._4_4_ = uVar12;
                  auVar178._0_4_ = uVar5;
                  auVar178._8_8_ = 0;
                  auVar183 = vsubps_avx(auVar178,auVar176);
                  auVar174 = auVar183;
                  if ((uVar148 & 1) != 0) {
                    auVar174 = vdivps_avx(auVar183,auVar175);
                  }
                  fVar168 = auVar174._0_4_;
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      auVar174 = vblendps_avx(auVar174,auVar183,2);
                      if ((uVar148 >> 1 & 1) != 0) {
                        auVar174 = vdivps_avx(auVar174,auVar175);
                      }
                      auVar174 = vmovshdup_avx(auVar174);
                      fVar168 = auVar174._0_4_;
                    }
                    else {
                      fVar168 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z - fVar186;
                      fVar168 = (float)((uint)bVar167 * (int)(fVar168 / fVar18) +
                                       (uint)!bVar167 * (int)fVar168);
                    }
                  }
                  iVar141 = (int)(fVar168 * 12.0);
                  if (iVar141 == 0xc) {
                    iVar141 = 0xb;
                  }
                  if ((int)uVar143 < iVar141) break;
                  pBVar145 = pBVar145 + 1;
                  pBVar149 = pBVar145;
                  if (pBVar145 == pBVar160) goto LAB_003f1799;
                }
                do {
                  pBVar149 = pBVar160;
                  pBVar160 = pBVar149 + -1;
                  if (pBVar160 == pBVar145) goto LAB_003f1799;
                  uVar6 = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                  uVar13 = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar179._4_4_ = uVar13;
                  auVar179._0_4_ = uVar6;
                  auVar179._8_8_ = 0;
                  auVar183 = vsubps_avx(auVar179,auVar176);
                  auVar174 = auVar183;
                  if ((uVar148 & 1) != 0) {
                    auVar174 = vdivps_avx(auVar183,auVar175);
                  }
                  fVar168 = auVar174._0_4_;
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      auVar174 = vblendps_avx(auVar174,auVar183,2);
                      if ((uVar148 >> 1 & 1) != 0) {
                        auVar174 = vdivps_avx(auVar174,auVar175);
                      }
                      auVar174 = vmovshdup_avx(auVar174);
                      fVar168 = auVar174._0_4_;
                    }
                    else {
                      fVar168 = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z - fVar186;
                      fVar168 = (float)((uint)bVar167 * (int)(fVar168 / fVar18) +
                                       (uint)!bVar167 * (int)fVar168);
                    }
                  }
                  iVar141 = (int)(fVar168 * 12.0);
                  if (iVar141 == 0xc) {
                    iVar141 = 0xb;
                  }
                } while ((int)uVar143 < iVar141);
                sStack_2d8 = pBVar145->primitiveIndex;
                uVar105 = (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar106 = (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar7 = *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar107 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar108 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar109 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar110 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                afStack_2bc[3] = (float)uVar8;
                afStack_2bc[4] = (float)((ulong)uVar8 >> 0x20);
                local_2c8 = (undefined4)uVar7;
                uStack_2c4 = (undefined4)((ulong)uVar7 >> 0x20);
                sVar20 = pBVar160->primitiveIndex;
                fVar137 = pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                fVar138 = pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z
                ;
                fVar139 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                fVar140 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar168 = pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar177 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                fVar181 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar28 = *(undefined8 *)
                          &pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                auVar170._0_4_ = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                fVar136 = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                *(undefined8 *)&(pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar28
                ;
                (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y = auVar170._0_4_;
                (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar136;
                pBVar145->primitiveIndex = sVar20;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar137;
                (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar138;
                *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar139;
                (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar140;
                uVar8 = CONCAT44(uVar109,uVar108);
                pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar106;
                pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)local_2c8;
                pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_2c4;
                pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar107;
                *(undefined8 *)&pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar8
                ;
                pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar110;
                pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = afStack_2bc[3];
                pBVar160->primitiveIndex = sStack_2d8;
                pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar105;
                pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar106;
                *(undefined8 *)&pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7
                ;
                pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar107;
                pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar108;
                pBVar149 = pBVar145 + 1;
                afStack_2bc[2] = (float)uVar110;
                afStack_2bc[1] = (float)uVar109;
                afStack_2bc[0] = (float)uVar108;
                uStack_2c0 = uVar107;
                uStack_2cc = uVar106;
                uStack_2d0 = uVar105;
              } while (pBVar160 != pBVar145 + 1);
              pBVar145 = pBVar145 + 1;
            }
LAB_003f1799:
            local_49c = (int)((ulong)((long)pBVar145 -
                                     (long)(bvhPrimitives->
                                           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555;
            goto LAB_003f229f;
          }
          LOCK();
          iVar141 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
          (orderedPrimsOffset->super___atomic_base<int>)._M_i =
               (orderedPrimsOffset->super___atomic_base<int>)._M_i + uVar150;
          UNLOCK();
          if (local_494 < local_498) {
            pPVar15 = (this->primitives).
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar16 = (orderedPrims->
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pBVar160 = (bvhPrimitives->
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_494;
            lVar142 = (long)local_498 - (long)local_494;
            iVar161 = iVar141;
            do {
              pPVar16[iVar161].
              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
              .bits = pPVar15[(int)pBVar160->primitiveIndex].
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      .bits;
              pBVar160 = pBVar160 + 1;
              iVar161 = iVar161 + 1;
              lVar142 = lVar142 + -1;
            } while (lVar142 != 0);
          }
          ((BVHBuildNode *)local_460)->firstPrimOffset = iVar141;
          ((BVHBuildNode *)local_460)->nPrimitives = uVar150;
          uVar7 = vmovlps_avx(auVar183);
          (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
               (float)(int)uVar7;
          (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (float)(int)((ulong)uVar7 >> 0x20);
          (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar181;
          uVar7 = vmovlps_avx(auVar174);
          (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x =
               (float)(int)uVar7;
          (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)(int)((ulong)uVar7 >> 0x20);
          (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar177;
          ((BVHBuildNode *)local_460)->children[0] = (BVHBuildNode *)0x0;
          ((BVHBuildNode *)local_460)->children[1] = (BVHBuildNode *)0x0;
          *(long *)(in_FS_OFFSET + -0xec) = *(long *)(in_FS_OFFSET + -0xec) + 1;
          *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
          uVar143 = (ulong)uVar150;
          goto LAB_003f0d61;
        }
        if (__comp._M_comp.dim != 0) {
          if (__comp._M_comp.dim == 1) {
            auVar174 = vmovshdup_avx(auVar176);
            auVar180 = ZEXT1664(auVar174);
          }
          else {
            auVar180 = ZEXT1664(auVar185);
          }
        }
        if (__comp._M_comp.dim != 0) {
          if (__comp._M_comp.dim == 1) {
            auVar174 = vmovshdup_avx(auVar178);
            auVar182 = ZEXT1664(auVar174);
          }
          else {
            auVar182 = ZEXT1664(auVar184);
          }
        }
        pBVar160 = (bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar145 = pBVar160 + lVar147;
        if (local_494 != local_498) {
          fVar168 = (auVar182._0_4_ + auVar180._0_4_) * 0.5;
          pBVar160 = pBVar160 + lVar142;
          pBVar149 = pBVar145;
          do {
            while( true ) {
              pBVar145 = pBVar149;
              if (__comp._M_comp.dim == 0) {
                pPVar144 = &pBVar145->centroid;
              }
              else if (__comp._M_comp.dim == 1) {
                pPVar144 = (Point3f *)&(pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              }
              else {
                pPVar144 = (Point3f *)&(pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              }
              if (fVar168 <= (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) break;
              pBVar145 = pBVar145 + 1;
              pBVar149 = pBVar145;
              if (pBVar145 == pBVar160) goto LAB_003f17e1;
            }
            do {
              pBVar149 = pBVar160;
              pBVar160 = pBVar149 + -1;
              if (pBVar160 == pBVar145) goto LAB_003f17e1;
              if (__comp._M_comp.dim == 0) {
                pPVar144 = &pBVar149[-1].centroid;
              }
              else if (__comp._M_comp.dim == 1) {
                pPVar144 = (Point3f *)&pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              }
              else {
                pPVar144 = (Point3f *)&pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              }
            } while (fVar168 <= (pPVar144->super_Tuple3<pbrt::Point3,_float>).x);
            uVar7 = *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
            uVar122 = pBVar145->primitiveIndex;
            uVar123 = (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            auVar118._8_4_ = uVar123;
            auVar118._0_8_ = uVar122;
            uVar8 = *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar95 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar96 = (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar97 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar98 = (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar28 = *(undefined8 *)&(pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar28;
            uStack_41c = (undefined4)((ulong)uVar28 >> 0x20);
            local_448._0_4_ = (undefined4)pBVar145->primitiveIndex;
            local_448._4_4_ = (undefined4)(pBVar145->primitiveIndex >> 0x20);
            local_448._8_4_ = (undefined4)uVar7;
            local_448._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
            uStack_438 = (undefined4)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar20 = pBVar160->primitiveIndex;
            uVar7 = *(undefined8 *)&pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
            uVar8 = *(undefined8 *)&pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar136 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar137 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar177 = pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar181 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar18 = pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar28 = *(undefined8 *)&pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar186 = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            auVar170._0_4_ = pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar177;
            (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar181;
            (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar18;
            *(undefined8 *)&(pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar28;
            (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar186;
            (pBVar145->centroid).super_Tuple3<pbrt::Point3,_float>.z = auVar170._0_4_;
            pBVar145->primitiveIndex = sVar20;
            *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float> = uVar7;
            *(undefined8 *)&(pBVar145->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
            (pBVar145->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar137;
            auVar118._12_4_ = local_448._12_4_;
            auVar118._16_4_ = uStack_438;
            auVar118._20_4_ = uStack_434;
            auVar118._24_4_ = uVar95;
            auVar118._28_4_ = uVar96;
            uVar7 = CONCAT44(uVar97,uVar96);
            pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)local_448._12_4_;
            pBVar149[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar95;
            *(undefined8 *)&pBVar149[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
            pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar98;
            pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar160->primitiveIndex = uVar122;
            (pBVar160->bounds).pMin = (Point3<float>)SUB2412(auVar118._8_24_,0);
            (pBVar160->bounds).pMax = (Point3<float>)SUB2412(auVar118._8_24_,0xc);
            pBVar149 = pBVar145 + 1;
            auStack_430[3] = uVar98;
            auStack_430[2] = uVar97;
            auStack_430[1] = uVar96;
            auStack_430[0] = uVar95;
          } while (pBVar160 != pBVar145 + 1);
          pBVar145 = pBVar145 + 1;
        }
LAB_003f17e1:
        local_49c = (int)((ulong)((long)pBVar145 -
                                 (long)(bvhPrimitives->
                                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555;
        if (local_494 != local_49c && local_498 != local_49c) goto LAB_003f229f;
      }
      local_49c = iVar141;
      if (iVar141 != local_498 && local_494 != local_498) {
        pBVar149 = (bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar160 = pBVar149 + lVar147;
        pBVar145 = pBVar149 + lVar142;
        uVar143 = lVar142 * 0x30 + lVar147 * -0x30;
        if ((long)uVar143 < 0x91) {
LAB_003f1e40:
          if ((pBVar160 != pBVar145) && (pBVar160 + 1 != pBVar145)) {
            local_490 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            local_488 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            pfVar151 = &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            pBVar149 = pBVar160 + 1;
            pBVar156 = pBVar160;
            do {
              pBVar152 = pBVar149;
              if (__comp._M_comp.dim == 0) {
                pPVar144 = &pBVar156[1].centroid;
              }
              else if (__comp._M_comp.dim == 1) {
                pPVar144 = (Point3f *)&pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              }
              else {
                pPVar144 = (Point3f *)&pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              }
              pBVar149 = (pointer)&pBVar160->centroid;
              if ((__comp._M_comp.dim != 0) && (pBVar149 = local_490, __comp._M_comp.dim != 1)) {
                pBVar149 = local_488;
              }
              if (((Tuple3<pbrt::Point3,_float> *)&pBVar149->primitiveIndex)->x <=
                  (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) {
                sVar20 = pBVar152->primitiveIndex;
                uVar7._0_4_ = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar7._4_4_ = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar28._0_4_ = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar28._4_4_ = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                local_448._0_4_ = (undefined4)sVar20;
                local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                uStack_438 = (undefined4)uVar8;
                uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
                uVar143._0_4_ = pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                uVar143._4_4_ = pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                auVar175._8_8_ = 0;
                auVar175._0_8_ = uVar143;
                auVar174 = vmovshdup_avx(auVar175);
                fVar168 = pBVar156[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                pfVar146 = pfVar151;
                pBVar149 = pBVar152;
                while( true ) {
                  fVar177 = (float)(undefined4)uVar143;
                  if ((__comp._M_comp.dim != 0) &&
                     (fVar177 = auVar174._0_4_, __comp._M_comp.dim != 1)) {
                    fVar177 = fVar168;
                  }
                  if (__comp._M_comp.dim == 0) {
                    pPVar144 = &pBVar149[-1].centroid;
                  }
                  else if (__comp._M_comp.dim == 1) {
                    pPVar144 = (Point3f *)&pBVar149[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y
                    ;
                  }
                  else {
                    pPVar144 = (Point3f *)(pfVar146 + -0xc);
                  }
                  if ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <= fVar177) break;
                  pBVar149 = pBVar149 + -1;
                  *(undefined8 *)(pfVar146 + -7) = *(undefined8 *)(pfVar146 + -0x13);
                  *(undefined8 *)(pfVar146 + -5) = *(undefined8 *)(pfVar146 + -0x11);
                  *(undefined8 *)(pfVar146 + -3) = *(undefined8 *)(pfVar146 + -0xf);
                  *(undefined8 *)(pfVar146 + -1) = *(undefined8 *)(pfVar146 + -0xd);
                  *(undefined8 *)(pfVar146 + -10) = *(undefined8 *)(pfVar146 + -0x16);
                  *(undefined8 *)(pfVar146 + -8) = *(undefined8 *)(pfVar146 + -0x14);
                  *(undefined8 *)(pfVar146 + -6) = *(undefined8 *)(pfVar146 + -0x12);
                  *(undefined8 *)(pfVar146 + -4) = *(undefined8 *)(pfVar146 + -0x10);
                  pfVar146 = pfVar146 + -0xc;
                }
                *(size_t *)(pfVar146 + -10) = sVar20;
                *(undefined8 *)(pfVar146 + -8) = uVar7;
                *(undefined8 *)(pfVar146 + -6) = uVar8;
                *(undefined8 *)(pfVar146 + -4) = uVar28;
                uVar8 = vmovlps_avx(auVar175);
                ((Tuple3<pbrt::Point3,_float> *)(pfVar146 + -2))->x = (float)(int)uVar8;
                ((Tuple3<pbrt::Point3,_float> *)(pfVar146 + -2))->y =
                     (float)(int)((ulong)uVar8 >> 0x20);
                *pfVar146 = fVar168;
                local_448._8_4_ = (undefined4)uVar7;
                local_448._12_4_ = uVar7._4_4_;
                auStack_430[0] = (undefined4)uVar28;
                auStack_430[1] = uVar28._4_4_;
              }
              else {
                uVar99 = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar100 = (pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar7 = *(undefined8 *)&(pBVar152->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar101 = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar102 = (pBVar152->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar103 = (pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar104 = (pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar8;
                uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._0_4_ = (undefined4)pBVar152->primitiveIndex;
                local_448._4_4_ = (undefined4)(pBVar152->primitiveIndex >> 0x20);
                uStack_438 = (undefined4)uVar7;
                uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                local_448._8_4_ = uVar99;
                local_448._12_4_ = uVar100;
                auStack_430[0] = uVar101;
                auStack_430[1] = uVar102;
                auStack_430[2] = uVar103;
                auStack_430[3] = uVar104;
                memmove((void *)((long)pBVar156 + (0x60 - ((long)pBVar152 - (long)pBVar160))),
                        pBVar160,(long)pBVar152 - (long)pBVar160);
                pBVar160->primitiveIndex = CONCAT44(local_448._4_4_,local_448._0_4_);
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_448._8_4_
                ;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (float)local_448._12_4_;
                *(ulong *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(uStack_434,uStack_438);
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[0];
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)auStack_430[1];
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (float)local_448._12_4_;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[0];
                *(ulong *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(auStack_430[2],auStack_430[1]);
                (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[3];
                (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
              }
              pfVar151 = pfVar151 + 0xc;
              pBVar149 = pBVar152 + 1;
              pBVar156 = pBVar152;
            } while (pBVar152 + 1 != pBVar145);
          }
        }
        else {
          pBVar149 = pBVar149 + iVar141;
          lVar142 = LZCOUNT((uVar143 >> 4) * -0x5555555555555555);
          if (lVar142 != 0x3f) {
            uVar148 = (ulong)(uint)((int)lVar142 * 2) ^ 0x7e;
            do {
              pPVar144 = &pBVar160[1].centroid;
              pPVar154 = pPVar144;
              if (__comp._M_comp.dim != 0) {
                if (__comp._M_comp.dim == 1) {
                  pPVar154 = (Point3f *)&pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                }
                else {
                  pPVar154 = (Point3f *)&pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                }
              }
              pBVar156 = pBVar160 + uVar143 / 0x60;
              pPVar162 = &pBVar156->centroid;
              pPVar164 = pPVar162;
              if (__comp._M_comp.dim != 0) {
                if (__comp._M_comp.dim == 1) {
                  pPVar164 = (Point3f *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                }
                else {
                  pPVar164 = (Point3f *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                }
              }
              pBVar152 = pBVar160 + 1;
              if ((pPVar164->super_Tuple3<pbrt::Point3,_float>).x <=
                  (pPVar154->super_Tuple3<pbrt::Point3,_float>).x) {
                if (__comp._M_comp.dim != 0) {
                  if (__comp._M_comp.dim == 1) {
                    pPVar144 = (Point3f *)&pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                  }
                  else {
                    pPVar144 = (Point3f *)&pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                  }
                }
                pPVar154 = &pBVar145[-1].centroid;
                pPVar164 = pPVar154;
                if (__comp._M_comp.dim != 0) {
                  if (__comp._M_comp.dim == 1) {
                    pPVar164 = (Point3f *)&pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y
                    ;
                  }
                  else {
                    pPVar164 = (Point3f *)&pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z
                    ;
                  }
                }
                if ((pPVar164->super_Tuple3<pbrt::Point3,_float>).x <=
                    (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) {
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      pPVar162 = (Point3f *)
                                 &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                    }
                    else {
                      pPVar162 = (Point3f *)
                                 &(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                    }
                  }
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      pPVar154 = (Point3f *)
                                 &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                    }
                    else {
                      pPVar154 = (Point3f *)
                                 &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                    }
                  }
                  if ((pPVar162->super_Tuple3<pbrt::Point3,_float>).x <
                      (pPVar154->super_Tuple3<pbrt::Point3,_float>).x) goto LAB_003f1a12;
                  goto LAB_003f1a62;
                }
LAB_003f19af:
                sVar20 = pBVar160->primitiveIndex;
                uVar59 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar60 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar7 = *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar61 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar62 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar63 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar64 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar8;
                uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._0_4_ = (undefined4)sVar20;
                local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                uStack_438 = (undefined4)uVar7;
                uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                sVar27 = pBVar152->primitiveIndex;
                auVar170._0_4_ = pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                fVar136 = pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar137 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                fVar138 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar168 = pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar177 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                fVar181 = pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar28 = *(undefined8 *)&pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z
                ;
                fVar18 = pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                fVar186 = pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar28
                ;
                (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                pBVar160->primitiveIndex = sVar27;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                uVar8 = CONCAT44(uVar63,uVar62);
                pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar60;
                pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar61;
                *(undefined8 *)&pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar64;
                pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                pBVar152->primitiveIndex = sVar20;
                pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar59;
                pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar60;
                *(undefined8 *)&pBVar160[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
                pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar61;
                pBVar160[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar62;
                local_448._8_4_ = uVar59;
                local_448._12_4_ = uVar60;
                auStack_430[0] = uVar61;
                auStack_430[1] = uVar62;
                auStack_430[2] = uVar63;
                auStack_430[3] = uVar64;
              }
              else {
                if (__comp._M_comp.dim != 0) {
                  if (__comp._M_comp.dim == 1) {
                    pPVar162 = (Point3f *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  }
                  else {
                    pPVar162 = (Point3f *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  }
                }
                pPVar154 = &pBVar145[-1].centroid;
                pPVar164 = pPVar154;
                if (__comp._M_comp.dim != 0) {
                  if (__comp._M_comp.dim == 1) {
                    pPVar164 = (Point3f *)&pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y
                    ;
                  }
                  else {
                    pPVar164 = (Point3f *)&pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z
                    ;
                  }
                }
                if ((pPVar162->super_Tuple3<pbrt::Point3,_float>).x <
                    (pPVar164->super_Tuple3<pbrt::Point3,_float>).x) {
LAB_003f1a62:
                  sVar20 = pBVar160->primitiveIndex;
                  uVar71 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  uVar72 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar7 = *(undefined8 *)
                           &(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar73 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar74 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar75 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                  uVar76 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  uVar8 = *(undefined8 *)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  uStack_420 = (undefined4)uVar8;
                  uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                  local_448._0_4_ = (undefined4)sVar20;
                  local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                  uStack_438 = (undefined4)uVar7;
                  uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                  sVar27 = pBVar156->primitiveIndex;
                  auVar170._0_4_ = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar136 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar8 = *(undefined8 *)
                           &(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar137 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar138 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar168 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar177 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar181 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar28 = *(undefined8 *)
                            &(pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar18 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  fVar186 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                       (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                  *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar28;
                  (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                  (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                  pBVar160->primitiveIndex = sVar27;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                  *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar8;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                  uVar8 = CONCAT44(uVar75,uVar74);
                  (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar72;
                  (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                  (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                  (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar73;
                  *(undefined8 *)&(pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar8;
                  (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar76;
                  (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                  pBVar156->primitiveIndex = sVar20;
                  (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar71;
                  (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar72;
                  *(undefined8 *)&(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar7;
                  (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar73;
                  (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar74;
                  local_448._8_4_ = uVar71;
                  local_448._12_4_ = uVar72;
                  auStack_430[0] = uVar73;
                  auStack_430[1] = uVar74;
                  auStack_430[2] = uVar75;
                  auStack_430[3] = uVar76;
                }
                else {
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      pPVar144 = (Point3f *)
                                 &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                    }
                    else {
                      pPVar144 = (Point3f *)
                                 &pBVar160[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                    }
                  }
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      pPVar154 = (Point3f *)
                                 &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                    }
                    else {
                      pPVar154 = (Point3f *)
                                 &pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                    }
                  }
                  if ((pPVar154->super_Tuple3<pbrt::Point3,_float>).x <=
                      (pPVar144->super_Tuple3<pbrt::Point3,_float>).x) goto LAB_003f19af;
LAB_003f1a12:
                  sVar20 = pBVar160->primitiveIndex;
                  uVar65 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  uVar66 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar7 = *(undefined8 *)
                           &(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar67 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar68 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar69 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                  uVar70 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  uVar8 = *(undefined8 *)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                  uStack_420 = (undefined4)uVar8;
                  uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                  local_448._0_4_ = (undefined4)sVar20;
                  local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                  uStack_438 = (undefined4)uVar7;
                  uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                  sVar27 = pBVar145[-1].primitiveIndex;
                  auVar170._0_4_ = pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar136 = pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar8 = *(undefined8 *)
                           &pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar137 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar138 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar168 = pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar177 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar181 = pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar28 = *(undefined8 *)
                            &pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar18 = pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar186 = pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                       pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                  *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar28;
                  (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                  (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                  pBVar160->primitiveIndex = sVar27;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                  (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                  *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar8;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                  (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                  uVar8 = CONCAT44(uVar69,uVar68);
                  pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar66;
                  pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                  pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                  pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar67;
                  *(undefined8 *)&pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar8;
                  pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar70;
                  pBVar145[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                  pBVar145[-1].primitiveIndex = sVar20;
                  pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar65;
                  pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar66;
                  *(undefined8 *)&pBVar145[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar7;
                  pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar67;
                  pBVar145[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar68;
                  local_448._8_4_ = uVar65;
                  local_448._12_4_ = uVar66;
                  auStack_430[0] = uVar67;
                  auStack_430[1] = uVar68;
                  auStack_430[2] = uVar69;
                  auStack_430[3] = uVar70;
                }
              }
              uVar148 = uVar148 - 1;
              pfVar151 = &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              pfVar146 = &(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              pBVar156 = pBVar145;
              while( true ) {
                pBVar166 = pBVar152 + -1;
                do {
                  pBVar165 = pBVar166;
                  if (__comp._M_comp.dim == 0) {
                    pPVar144 = &pBVar152->centroid;
                  }
                  else if (__comp._M_comp.dim == 1) {
                    pPVar144 = (Point3f *)&(pBVar152->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  }
                  else {
                    pPVar144 = (Point3f *)&pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                  }
                  pPVar154 = &pBVar160->centroid;
                  if ((__comp._M_comp.dim != 0) &&
                     (pPVar154 = (Point3f *)pfVar151, __comp._M_comp.dim != 1)) {
                    pPVar154 = (Point3f *)pfVar146;
                  }
                  pBVar152 = pBVar152 + 1;
                  pBVar166 = pBVar165 + 1;
                } while ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <
                         (pPVar154->super_Tuple3<pbrt::Point3,_float>).x);
                pBVar152 = pBVar165 + 2;
                do {
                  pBVar163 = pBVar156;
                  pPVar144 = &pBVar160->centroid;
                  if ((__comp._M_comp.dim != 0) &&
                     (pPVar144 = (Point3f *)pfVar151, __comp._M_comp.dim != 1)) {
                    pPVar144 = (Point3f *)pfVar146;
                  }
                  if (__comp._M_comp.dim == 0) {
                    pPVar154 = &pBVar163[-1].centroid;
                  }
                  else if (__comp._M_comp.dim == 1) {
                    pPVar154 = (Point3f *)&pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y
                    ;
                  }
                  else {
                    pPVar154 = (Point3f *)&pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z
                    ;
                  }
                  pBVar156 = pBVar163 + -1;
                } while ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <
                         (pPVar154->super_Tuple3<pbrt::Point3,_float>).x);
                if (pBVar156 <= pBVar166) break;
                sVar20 = pBVar166->primitiveIndex;
                uVar77 = pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar78 = pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar7 = *(undefined8 *)&pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar79 = pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar80 = pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar81 = pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                uVar82 = pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar8;
                uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._0_4_ = (undefined4)sVar20;
                local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
                uStack_438 = (undefined4)uVar7;
                uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                sVar27 = pBVar156->primitiveIndex;
                auVar170._0_4_ = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                fVar136 = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z
                ;
                fVar137 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                fVar138 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar168 = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar177 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                fVar181 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar28 = *(undefined8 *)
                          &pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar18 = pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                fVar186 = pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                *(undefined8 *)&pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar28
                ;
                pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                pBVar165[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                pBVar166->primitiveIndex = sVar27;
                pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                *(undefined8 *)&pBVar165[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                pBVar165[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                uVar8 = CONCAT44(uVar81,uVar80);
                pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar78;
                pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar79;
                *(undefined8 *)&pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar8
                ;
                pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar82;
                pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                pBVar156->primitiveIndex = sVar20;
                pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar77;
                pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar78;
                *(undefined8 *)&pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7
                ;
                pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar79;
                pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar80;
                local_448._8_4_ = uVar77;
                local_448._12_4_ = uVar78;
                auStack_430[0] = uVar79;
                auStack_430[1] = uVar80;
                auStack_430[2] = uVar81;
                auStack_430[3] = uVar82;
              }
              if (pBVar166 <= pBVar149) {
                pBVar160 = pBVar166;
                pBVar166 = pBVar145;
              }
              pBVar145 = pBVar166;
              uVar143 = (long)pBVar145 - (long)pBVar160;
              if ((long)uVar143 < 0x91) goto LAB_003f1e40;
            } while (uVar148 != 0);
          }
          pBVar156 = pBVar149 + 1;
          lVar142 = ((long)pBVar156 - (long)pBVar160 >> 4) * -0x5555555555555555;
          local_478 = pBVar145;
          local_468 = pBVar149;
          if (0x5f < (long)pBVar156 - (long)pBVar160) {
            uVar143 = lVar142 - 2U >> 1;
            do {
              pBVar1 = pBVar160 + uVar143;
              uVar127 = pBVar1->primitiveIndex;
              auVar128 = *(undefined1 (*) [12])&(pBVar1->bounds).pMin;
              auVar129 = *(undefined1 (*) [12])&(pBVar1->bounds).pMax;
              __value_01.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                   (Tuple3<pbrt::Point3,_float>)auVar129;
              __value_01.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                   (Tuple3<pbrt::Point3,_float>)auVar128;
              __value_01.primitiveIndex = uVar127;
              __value_01._32_16_ =
                   SUB3216(*(undefined1 (*) [32])
                            &pBVar160[uVar143].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z,0x10)
              ;
              std::
              __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>>
                        (pBVar160,uVar143,lVar142,__value_01,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:257:34)>
                          )__comp._M_comp.dim);
              bVar167 = uVar143 != 0;
              uVar143 = uVar143 - 1;
            } while (bVar167);
          }
          pBVar145 = local_478;
          if (pBVar156 < local_478) {
            local_490 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            local_488 = (pointer)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            do {
              if (__comp._M_comp.dim == 0) {
                pPVar144 = &pBVar156->centroid;
              }
              else if (__comp._M_comp.dim == 1) {
                pPVar144 = (Point3f *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              }
              else {
                pPVar144 = (Point3f *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              }
              pBVar149 = (pointer)&pBVar160->centroid;
              if ((__comp._M_comp.dim != 0) && (pBVar149 = local_490, __comp._M_comp.dim != 1)) {
                pBVar149 = local_488;
              }
              if ((pPVar144->super_Tuple3<pbrt::Point3,_float>).x <
                  ((Tuple3<pbrt::Point3,_float> *)&pBVar149->primitiveIndex)->x) {
                uVar83 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar84 = (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                pfVar151 = &(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar7 = *(undefined8 *)pfVar151;
                uVar85 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar86 = (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar133 = pBVar156->primitiveIndex;
                auVar134 = *(undefined1 (*) [12])&(pBVar156->bounds).pMin;
                auVar135 = *(undefined1 (*) [12])&(pBVar156->bounds).pMax;
                __value_02.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                     (Tuple3<pbrt::Point3,_float>)auVar135;
                __value_02.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                     (Tuple3<pbrt::Point3,_float>)auVar134;
                __value_02.primitiveIndex = uVar133;
                auVar121 = *(undefined1 (*) [12])pfVar151;
                uVar87 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar88 = (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar8;
                uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._0_4_ = (undefined4)pBVar156->primitiveIndex;
                local_448._4_4_ = (undefined4)(pBVar156->primitiveIndex >> 0x20);
                uStack_438 = (undefined4)uVar7;
                uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
                sVar20 = pBVar160->primitiveIndex;
                auVar170._0_4_ = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                fVar136 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar7 = *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar137 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                fVar138 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar168 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar177 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
                fVar181 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar18 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                fVar186 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
                (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
                (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
                *(undefined8 *)&(pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
                (pBVar156->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
                pBVar156->primitiveIndex = sVar20;
                (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
                (pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
                *(undefined8 *)&(pBVar156->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
                (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
                (pBVar156->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
                auVar120._12_4_ = uVar86;
                auVar120._0_12_ = auVar121;
                auVar120._16_4_ = uVar87;
                auVar120._20_4_ = uVar88;
                auVar120._24_4_ = uStack_420;
                auVar120._28_4_ = uStack_41c;
                __value_02._32_16_ = auVar120._16_16_;
                local_448._8_4_ = uVar83;
                local_448._12_4_ = uVar84;
                auStack_430[0] = uVar85;
                auStack_430[1] = uVar86;
                auStack_430[2] = uVar87;
                auStack_430[3] = uVar88;
                std::
                __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>>
                          (pBVar160,0,lVar142,__value_02,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:257:34)>
                            )__comp._M_comp.dim);
              }
              pBVar156 = pBVar156 + 1;
            } while (pBVar156 < pBVar145);
          }
          sVar20 = pBVar160->primitiveIndex;
          uVar89 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
          uVar90 = (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
          uVar7 = *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
          uVar91 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
          uVar92 = (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
          uVar93 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.x;
          uVar94 = (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y;
          uVar8 = *(undefined8 *)&(pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z;
          uStack_420 = (undefined4)uVar8;
          uStack_41c = (undefined4)((ulong)uVar8 >> 0x20);
          local_448._0_4_ = (undefined4)sVar20;
          local_448._4_4_ = (undefined4)(sVar20 >> 0x20);
          uStack_438 = (undefined4)uVar7;
          uStack_434 = (undefined4)((ulong)uVar7 >> 0x20);
          sVar27 = local_468->primitiveIndex;
          auVar170._0_4_ = (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
          fVar136 = (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
          uVar8 = *(undefined8 *)&(local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
          fVar137 = (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
          fVar138 = (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
          fVar168 = (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
          fVar177 = (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
          fVar181 = (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
          uVar28 = *(undefined8 *)&(local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
          fVar18 = (local_468->centroid).super_Tuple3<pbrt::Point3,_float>.y;
          fVar186 = (local_468->centroid).super_Tuple3<pbrt::Point3,_float>.z;
          (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
          (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar168;
          (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar177;
          (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar181;
          *(undefined8 *)&(pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar28;
          (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar18;
          (pBVar160->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar186;
          pBVar160->primitiveIndex = sVar27;
          (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = auVar170._0_4_;
          (pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar136;
          *(undefined8 *)&(pBVar160->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
          (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar137;
          (pBVar160->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar138;
          uVar8 = CONCAT44(uVar93,uVar92);
          (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar90;
          (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
          (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
          (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar91;
          *(undefined8 *)&(local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
          (local_468->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar94;
          (local_468->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
          local_468->primitiveIndex = sVar20;
          (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar89;
          (local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar90;
          *(undefined8 *)&(local_468->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
          (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar91;
          (local_468->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar92;
          local_448._8_4_ = uVar89;
          local_448._12_4_ = uVar90;
          auStack_430[0] = uVar91;
          auStack_430[1] = uVar92;
          auStack_430[2] = uVar93;
          auStack_430[3] = uVar94;
        }
      }
LAB_003f229f:
      threadAllocators_00 = local_450;
      this_00 = local_458;
      bvhPrimitives_00 = local_480;
      orderedPrims_00 = orderedPrims;
      if (local_498 - local_494 < 0x20001) {
        local_2a8[0] = buildRecursive(local_458,local_450,local_480,local_494,local_49c,
                                      (atomic<int> *)local_470,orderedPrimsOffset,orderedPrims);
        local_2a8[1] = buildRecursive(this_00,threadAllocators_00,bvhPrimitives_00,local_49c,
                                      local_498,(atomic<int> *)local_470,orderedPrimsOffset,
                                      orderedPrims_00);
        this_01 = local_460;
      }
      else {
        local_2f8 = (long *)0x0;
        uStack_2f0 = 0;
        pcStack_2e8 = (code *)0x0;
        pcStack_2e0 = (code *)0x0;
        local_2f8 = (long *)operator_new(0x50);
        *local_2f8 = (long)local_2a8;
        local_2f8[1] = (long)local_458;
        local_2f8[2] = (long)local_450;
        local_2f8[3] = (long)local_480;
        local_2f8[4] = (long)&local_494;
        local_2f8[5] = (long)&local_49c;
        local_2f8[6] = (long)&local_470;
        local_2f8[7] = (long)&orderedPrimsOffset;
        local_2f8[8] = (long)orderedPrims;
        local_2f8[9] = (long)&local_498;
        pcStack_2e0 = std::
                      _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:366:35)>
                      ::_M_invoke;
        pcStack_2e8 = std::
                      _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:366:35)>
                      ::_M_manager;
        local_448._8_4_ = 0;
        local_448._12_4_ = 0;
        auStack_430[0] = 0x2a384c;
        auStack_430[1] = 0;
        uStack_438 = 0x2a3852;
        uStack_434 = 0;
        local_448._0_8_ = &local_2f8;
        ParallelFor(0,2,(function<void_(long,_long)> *)local_448);
        this_01 = local_460;
        if ((code *)CONCAT44(uStack_434,uStack_438) != (code *)0x0) {
          (*(code *)CONCAT44(uStack_434,uStack_438))(local_448,local_448,3);
        }
        if (pcStack_2e8 != (code *)0x0) {
          (*pcStack_2e8)(&local_2f8,&local_2f8,3);
        }
      }
      BVHBuildNode::InitInterior
                ((BVHBuildNode *)this_01,(int)__comp._M_comp.dim,local_2a8[0],local_2a8[1]);
      return (BVHBuildNode *)this_01;
    }
    LOCK();
    iVar141 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
    (orderedPrimsOffset->super___atomic_base<int>)._M_i =
         (orderedPrimsOffset->super___atomic_base<int>)._M_i + uVar150;
    UNLOCK();
    if (local_494 < local_498) {
      pPVar15 = (this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar16 = (orderedPrims->
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pBVar160 = (bvhPrimitives->
                 super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_494;
      lVar142 = (long)local_498 - (long)local_494;
      iVar161 = iVar141;
      do {
        pPVar16[iVar161].
        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        .bits = pPVar15[(int)pBVar160->primitiveIndex].
                super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                .bits;
        pBVar160 = pBVar160 + 1;
        iVar161 = iVar161 + 1;
        lVar142 = lVar142 + -1;
      } while (lVar142 != 0);
    }
  }
  ((BVHBuildNode *)local_460)->firstPrimOffset = iVar141;
  ((BVHBuildNode *)local_460)->nPrimitives = uVar150;
  uVar7 = vmovlps_avx(auVar183);
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar7
  ;
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar7 >> 0x20);
  (((BVHBuildNode *)local_460)->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar181;
  uVar7 = vmovlps_avx(auVar174);
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar7
  ;
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar7 >> 0x20);
  (((BVHBuildNode *)local_460)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar177;
  ((BVHBuildNode *)local_460)->children[0] = (BVHBuildNode *)0x0;
  ((BVHBuildNode *)local_460)->children[1] = (BVHBuildNode *)0x0;
  *(long *)(in_FS_OFFSET + -0xec) = *(long *)(in_FS_OFFSET + -0xec) + 1;
  *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
  uVar143 = (ulong)(int)uVar150;
LAB_003f0d61:
  *(ulong *)(in_FS_OFFSET + -0xf2) = *(long *)(in_FS_OFFSET + -0xf2) + uVar143;
  return (BVHBuildNode *)local_460;
}

Assistant:

BVHBuildNode *BVHAggregate::buildRecursive(std::vector<Allocator> &threadAllocators,
                                           std::vector<BVHPrimitive> &bvhPrimitives,
                                           int start, int end,
                                           std::atomic<int> *totalNodes,
                                           std::atomic<int> *orderedPrimsOffset,
                                           std::vector<PrimitiveHandle> &orderedPrims) {
    DCHECK_NE(start, end);
    Allocator alloc = threadAllocators[ThreadIndex];
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();
    // Initialize _BVHBuildNode_ for primitive range
    ++*totalNodes;
    // Compute bounds of all primitives in BVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, bvhPrimitives[i].bounds);

    int nPrimitives = end - start;
    if (bounds.SurfaceArea() == 0 || nPrimitives == 1) {
        // Create leaf _BVHBuildNode_
        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
        for (int i = start; i < end; ++i) {
            int index = bvhPrimitives[i].primitiveIndex;
            orderedPrims[firstPrimOffset + i - start] = primitives[index];
        }
        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
        return node;

    } else {
        // Compute bound of primitive centroids, choose split dimension _dim_
        Bounds3f centroidBounds;
        for (int i = start; i < end; ++i)
            centroidBounds = Union(centroidBounds, bvhPrimitives[i].centroid);
        int dim = centroidBounds.MaxDimension();

        // Partition primitives into two sets and build children
        int mid = (start + end) / 2;
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim]) {
            // Create leaf _BVHBuildNode_
            int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
            for (int i = start; i < end; ++i) {
                int index = bvhPrimitives[i].primitiveIndex;
                orderedPrims[firstPrimOffset + i - start] = primitives[index];
            }
            node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
            return node;

        } else {
            // Partition primitives based on _splitMethod_
            switch (splitMethod) {
            case SplitMethod::Middle: {
                // Partition primitives through node's midpoint
                Float pmid = (centroidBounds.pMin[dim] + centroidBounds.pMax[dim]) / 2;
                BVHPrimitive *midPtr =
                    std::partition(&bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                                   [dim, pmid](const BVHPrimitive &pi) {
                                       return pi.centroid[dim] < pmid;
                                   });
                mid = midPtr - &bvhPrimitives[0];
                // For lots of prims with large overlapping bounding boxes, this
                // may fail to partition; in that case don't break and fall through
                // to EqualCounts.
                if (mid != start && mid != end)
                    break;
            }
            case SplitMethod::EqualCounts: {
                // Partition primitives into equally sized subsets
                mid = (start + end) / 2;
                std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                 &bvhPrimitives[end - 1] + 1,
                                 [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                     return a.centroid[dim] < b.centroid[dim];
                                 });

                break;
            }
            case SplitMethod::SAH:
            default: {
                // Partition primitives using approximate SAH
                if (nPrimitives <= 2) {
                    // Partition primitives into equally sized subsets
                    mid = (start + end) / 2;
                    std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                     &bvhPrimitives[end - 1] + 1,
                                     [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                         return a.centroid[dim] < b.centroid[dim];
                                     });

                } else {
                    // Allocate _BVHSplitBucket_ for SAH partition buckets
                    constexpr int nBuckets = 12;
                    BVHSplitBucket buckets[nBuckets];

                    // Initialize _BVHSplitBucket_ for SAH partition buckets
                    for (int i = start; i < end; ++i) {
                        int b = nBuckets *
                                centroidBounds.Offset(bvhPrimitives[i].centroid)[dim];
                        if (b == nBuckets)
                            b = nBuckets - 1;
                        DCHECK_GE(b, 0);
                        DCHECK_LT(b, nBuckets);
                        buckets[b].count++;
                        buckets[b].bounds =
                            Union(buckets[b].bounds, bvhPrimitives[i].bounds);
                    }

                    // Compute costs for splitting after each bucket
                    constexpr int nSplits = nBuckets - 1;
                    int countBelow[nSplits], countAbove[nSplits];
                    Bounds3f boundsBelow[nSplits], boundsAbove[nSplits];
                    // Initialize _countBelow_ and _boundsBelow_ using a forward scan over
                    // splits
                    countBelow[0] = buckets[0].count;
                    boundsBelow[0] = buckets[0].bounds;
                    for (int i = 1; i < nSplits; ++i) {
                        countBelow[i] = countBelow[i - 1] + buckets[i].count;
                        boundsBelow[i] = Union(boundsBelow[i - 1], buckets[i].bounds);
                    }

                    // Initialize _countAbove_ and _boundsAbove_ using a backwards scan
                    // over splits
                    countAbove[nSplits - 1] = buckets[nBuckets - 1].count;
                    boundsAbove[nSplits - 1] = buckets[nBuckets - 1].bounds;
                    for (int i = nSplits - 2; i >= 0; --i) {
                        countAbove[i] = countAbove[i + 1] + buckets[i + 1].count;
                        boundsAbove[i] = Union(boundsAbove[i + 1], buckets[i + 1].bounds);
                    }

                    // Find bucket to split at that minimizes SAH metric
                    int minCostSplitBucket = -1;
                    Float minCost = Infinity;
                    for (int i = 0; i < nSplits; ++i) {
                        // Compute cost for candidate split and update minimum if
                        // necessary
                        if (countBelow[i] == 0 || countAbove[i] == 0)
                            continue;
                        Float cost = (countBelow[i] * boundsBelow[i].SurfaceArea() +
                                      countAbove[i] * boundsAbove[i].SurfaceArea());
                        if (cost < minCost) {
                            minCost = cost;
                            minCostSplitBucket = i;
                        }
                    }
                    // Compute leaf cost and SAH split cost for chosen split
                    Float leafCost = nPrimitives;
                    minCost = 1.f / 2.f + minCost / bounds.SurfaceArea();

                    // Either create leaf or split primitives at selected SAH bucket
                    if (nPrimitives > maxPrimsInNode || minCost < leafCost) {
                        BVHPrimitive *pmid = std::partition(
                            &bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                            [=](const BVHPrimitive &bp) {
                                int b =
                                    nBuckets * centroidBounds.Offset(bp.centroid)[dim];
                                if (b == nBuckets)
                                    b = nBuckets - 1;
                                return b <= minCostSplitBucket;
                            });
                        mid = pmid - &bvhPrimitives[0];
                    } else {
                        // Create leaf _BVHBuildNode_
                        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
                        for (int i = start; i < end; ++i) {
                            int index = bvhPrimitives[i].primitiveIndex;
                            orderedPrims[firstPrimOffset + i - start] = primitives[index];
                        }
                        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
                        return node;
                    }
                }

                break;
            }
            }

            BVHBuildNode *children[2];
            // Recursively build BVHs for _children_
            if (end - start > 128 * 1024) {
                // Recursively build child BVHs in parallel
                ParallelFor(0, 2, [&](int i) {
                    if (i == 0)
                        children[0] =
                            buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                    else
                        children[1] =
                            buildRecursive(threadAllocators, bvhPrimitives, mid, end,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                });

            } else {
                // Recursively build child BVHs sequentially
                children[0] =
                    buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                   totalNodes, orderedPrimsOffset, orderedPrims);
                children[1] =
                    buildRecursive(threadAllocators, bvhPrimitives, mid, end, totalNodes,
                                   orderedPrimsOffset, orderedPrims);
            }

            node->InitInterior(dim, children[0], children[1]);
        }
    }

    return node;
}